

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte *__src;
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  long lVar9;
  ushort *puVar10;
  uint uVar11;
  int iVar12;
  size_t __n;
  int iVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  void *__dest;
  vm_val_t new_ins_str;
  char ins_buf [128];
  vm_val_t local_c8;
  char local_b8 [136];
  
  if (argc == (uint *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = *argc;
  }
  if (getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_splice();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_splice::desc);
  if (iVar6 == 0) {
    iVar6 = CVmBif::pop_int_val();
    iVar7 = CVmBif::pop_int_val();
    pvVar4 = sp_;
    uVar1 = *(ushort *)str;
    uVar15 = (ulong)uVar1;
    __src = (byte *)(str + 2);
    iVar12 = 0;
    if (uVar15 != 0) {
      iVar12 = 0;
      pbVar14 = __src;
      do {
        pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 & (uint)(*pbVar14 >> 7) * 3) + 1;
        iVar12 = iVar12 + 1;
      } while (pbVar14 < str + uVar15 + 2);
    }
    iVar13 = -1;
    if (iVar6 < 0) {
      iVar13 = iVar12;
    }
    iVar13 = iVar13 + iVar6;
    iVar6 = iVar12;
    if (iVar13 < iVar12) {
      iVar6 = iVar13;
    }
    if (iVar13 < 0) {
      iVar6 = 0;
    }
    iVar13 = iVar12 - iVar6;
    if (iVar7 < iVar12 - iVar6) {
      iVar13 = iVar7;
    }
    if (iVar7 < 0) {
      iVar13 = 0;
    }
    if (iVar6 == 0) {
      lVar17 = 2;
    }
    else {
      lVar9 = (long)iVar6;
      lVar17 = 2;
      do {
        lVar17 = lVar17 + (ulong)((((byte)str[lVar17] >> 5 & 1) != 0) + 1 &
                                 (uint)((byte)str[lVar17] >> 7) * 3) + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    local_c8.typ = VM_NIL;
    __n = 0;
    puVar10 = (ushort *)0x0;
    if (2 < uVar16) {
      __n = 0;
      puVar10 = (ushort *)0x0;
      if (sp_[-2].typ != VM_NIL) {
        puVar10 = (ushort *)cvt_to_str(&local_c8,local_b8,0x80,sp_ + -2,10,0);
        __n = (size_t)*puVar10;
        puVar10 = puVar10 + 1;
      }
    }
    pvVar4 = sp_;
    pvVar5 = sp_ + 1;
    *(ulong *)sp_ = CONCAT44(local_c8._4_4_,local_c8.typ);
    sp_ = pvVar5;
    pvVar4->val = local_c8.val;
    if ((iVar13 == 0) && (__n == 0)) {
      uVar3 = *(undefined4 *)&self_val->field_0x4;
      aVar2 = self_val->val;
      retval->typ = self_val->typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
    }
    else {
      pbVar18 = (byte *)(str + lVar17);
      pbVar14 = pbVar18;
      if (iVar13 != 0) {
        lVar9 = (long)iVar13;
        do {
          pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 & (uint)(*pbVar14 >> 7) * 3) +
                              1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      vVar8 = create(0,(uVar15 + __n) - ((long)pbVar14 - (long)pbVar18));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar8;
      lVar9 = *(long *)((long)&G_obj_table_X.pages_[vVar8 >> 0xc][vVar8 & 0xfff].ptr_ + 8);
      __dest = (void *)(lVar9 + 2);
      if (lVar17 != 2) {
        memcpy(__dest,__src,lVar17 - 2U);
        __dest = (void *)(lVar9 + lVar17);
      }
      if (__n != 0) {
        memcpy(__dest,puVar10,__n);
        __dest = (void *)((long)__dest + __n);
      }
      lVar17 = ((long)pbVar14 - (long)pbVar18) + (lVar17 - 2U);
      uVar11 = (uint)uVar1 - (int)lVar17;
      if (0 < (int)uVar11) {
        memcpy(__dest,__src + lVar17,(ulong)(uVar11 & 0x7fffffff));
      }
    }
    sp_ = sp_ + -(long)(int)uVar16;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_splice(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *argc)
{
    char ins_buf[128];

    /* check arguments */
    uint oargc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting index and deletion length */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_char_len = CVmBif::pop_int_val(vmg0_);

    /* get and skip our length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;
    utf8_ptr p((char *)str);
    int charlen = p.len(len);

    /* adjust the index to 0-based, and figure end-of-string offsets */
    start_idx += (start_idx < 0 ? charlen : -1);

    /* make sure the starting index and deletion length are in bounds */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > (int)charlen ? charlen :
                 start_idx);
    del_char_len = (del_char_len < 0 ? 0 :
                    del_char_len > (int)(charlen - start_idx) ? charlen - start_idx :
                    del_char_len);

    /* get the starting byte index */
    size_t start_byte_idx = p.bytelen(start_idx);

    /* save 'self' as gc protection */
    G_stk->push(self_val);
    
    /* 
     *   If there's an insertion string, get it as a string.  Treat nil as an
     *   empty insertion.  
     */
    size_t ins_byte_len = 0;
    const char *ins = 0;
    vm_val_t new_ins_str;
    new_ins_str.set_nil();
    if (oargc >= 3 && G_stk->get(1)->typ != VM_NIL)
    {
        /* 
         *   Leave the insertion string on the stack for gc protection, and
         *   do an explicit conversion to string.  
         */
        ins = cvt_to_str(vmg_ &new_ins_str, ins_buf, sizeof(ins_buf),
                         G_stk->get(1), 10, 0);
        ins_byte_len = vmb_get_len(ins);
        ins += VMB_LEN;
    }

    /* push the new insertion string (if any) for gc protection */
    G_stk->push(&new_ins_str);

    /* check to see if we're making any changes */
    if (del_char_len != 0 || ins_byte_len != 0)
    {
        /* figure the byte length to be deleted */
        size_t del_byte_len = utf8_ptr::s_bytelen(str + start_byte_idx, del_char_len);

        /* allocate a new string at the proper length */
        retval->set_obj(create(vmg_ FALSE, len + ins_byte_len - del_byte_len));
        CVmObjString *new_str = (CVmObjString *)vm_objp(vmg_ retval->val.obj);
        char *newp = new_str->cons_get_buf();

        /* copy the part of our string up to the starting index */
        if (start_byte_idx > 0)
        {
            memcpy(newp, str, start_byte_idx);
            newp += start_byte_idx;
        }

        /* if we have an insertion string, copy it */
        if (ins_byte_len != 0)
        {
            memcpy(newp, ins, ins_byte_len);
            newp += ins_byte_len;
        }

        /* if there's anything after the deleted section, add it */
        size_t tail_byte_idx = start_byte_idx + del_byte_len;
        int tail_byte_len = len - tail_byte_idx;
        if (tail_byte_len > 0)
            memcpy(newp, str + tail_byte_idx, tail_byte_len);
    }
    else
    {
        /* we're making no changes - return the original string */
        *retval = *self_val;
    }

    /* 
     *   discard the remaining arguments and the gc protection (original
     *   argc, minus 2 arg pops, plus 2 gc protection pushes -> oargc) 
     */
    G_stk->discard(oargc); 

    /* handled */
    return TRUE;
}